

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

void Fixpp::
     set<Fixpp::TagT<112u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)48>,Fixpp::TagT<112u,Fixpp::Type::String>>,char_const(&)[8]>
               (VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>
                *message,char (*value) [8])

{
  bitset<1UL> *pbVar1;
  size_type __len1;
  size_t __len2;
  
  __len1 = *(size_type *)
            ((long)&(message->
                    super_MessageT<Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>).
                    super_MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>.values.
                    base.
                    super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<112U,_Fixpp::Type::String>_>,_false>
                    .value.val_ + 8);
  __len2 = strlen(*value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message,0,__len1,
             *value,__len2);
  (message->super_MessageT<Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>).
  super_MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>.values.base.
  super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<112U,_Fixpp::Type::String>_>,_false>.value.empty_
       = false;
  pbVar1 = &(message->super_MessageT<Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>).
            super_MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>.allBits;
  *(byte *)&(pbVar1->super__Base_bitset<1UL>)._M_w =
       (byte)(pbVar1->super__Base_bitset<1UL>)._M_w | 1;
  return;
}

Assistant:

decltype(auto)
    set(Message& message, Value&& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(Index::Valid, "Invalid tag for given message");
        static_assert(details::IsValidTypeFor<Tag, Value>::value, "Invalid data type for given Tag");

        meta::get<Index::Value>(message.values).set(std::forward<Value>(value));

        message.allBits.set(Index::Value);

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));
    }